

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::QueueSharedDependencies
          (cmComputeLinkDepends *this,size_t depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps)

{
  bool bVar1;
  undefined1 local_b0 [8];
  SharedDepEntry qe;
  cmLinkItem *li;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps_local;
  size_t depender_index_local;
  cmComputeLinkDepends *this_local;
  
  __end1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(deps);
  li = (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(deps);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                *)&li);
    if (!bVar1) break;
    qe.DependerIndex =
         (size_t)__gnu_cxx::
                 __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                 ::operator*(&__end1);
    SharedDepEntry::SharedDepEntry((SharedDepEntry *)local_b0);
    cmLinkItem::operator=((cmLinkItem *)local_b0,(cmLinkItem *)qe.DependerIndex);
    qe.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)depender_index;
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::push(&this->SharedDepQueue,(value_type *)local_b0);
    SharedDepEntry::~SharedDepEntry((SharedDepEntry *)local_b0);
    __gnu_cxx::
    __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::QueueSharedDependencies(
  size_t depender_index, std::vector<cmLinkItem> const& deps)
{
  for (cmLinkItem const& li : deps) {
    SharedDepEntry qe;
    qe.Item = li;
    qe.DependerIndex = depender_index;
    this->SharedDepQueue.push(qe);
  }
}